

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O1

char * libtorrent::job_name(job_action_t job)

{
  uint uVar1;
  undefined1 *puVar2;
  undefined3 in_register_00000039;
  
  if (0x15 < job) {
    return "unknown";
  }
  if (job < num_job_ids) {
    uVar1 = (uint)job;
    puVar2 = job_action_name;
  }
  else {
    uVar1 = CONCAT31(in_register_00000039,job) - 0xf;
    puVar2 = piece_log_t::job_names;
  }
  return *(char **)(puVar2 + (ulong)uVar1 * 8);
}

Assistant:

char const* job_name(job_action_t const job)
	{
		int const j = static_cast<int>(job);
		if (j < 0 || j >= piece_log_t::last_job)
			return "unknown";

		if (j < piece_log_t::flushing)
			return job_action_name[static_cast<std::size_t>(j)];
		return piece_log_t::job_names[static_cast<std::size_t>(j - piece_log_t::flushing)];
	}